

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDColor.cpp
# Opt level: O2

void __thiscall EDColor::smoothChannel(EDColor *this,uchar *src,uchar *smooth,double sigma)

{
  Mat smoothImage;
  Mat srcImage;
  
  cv::Mat::Mat(&srcImage,this->height,this->width,0,src,0);
  cv::Mat::Mat(&smoothImage,this->height,this->width,0,smooth,0);
  if ((sigma != 1.0) || (NAN(sigma))) {
    if ((sigma != 1.5) || (NAN(sigma))) {
      cv::GaussianBlur(sigma,0);
    }
    else {
      cv::GaussianBlur(0x3ff8000000000000,0);
    }
  }
  else {
    cv::GaussianBlur(0x3ff0000000000000,0);
  }
  cv::Mat::~Mat(&smoothImage);
  cv::Mat::~Mat(&srcImage);
  return;
}

Assistant:

void EDColor::smoothChannel(uchar *src, uchar *smooth, double sigma)
{
	Mat srcImage = Mat(height, width, CV_8UC1, src);
	Mat smoothImage = Mat(height, width, CV_8UC1, smooth);

	if (sigma == 1.0)
		GaussianBlur(srcImage, smoothImage, Size(5, 5), 1);
	else if (sigma == 1.5)
		GaussianBlur(srcImage, smoothImage, Size(7, 7), 1.5);  // seems to be better?
	else
		GaussianBlur(srcImage, smoothImage, Size(), sigma);
}